

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519_64_adx.h
# Opt level: O0

void fiat_subborrowx_u64(uint64_t *out1,fiat_uint1 *out2,fiat_uint1 arg1,uint64_t arg2,uint64_t arg3
                        )

{
  unsigned_long_long t;
  uint64_t arg3_local;
  uint64_t arg2_local;
  fiat_uint1 arg1_local;
  fiat_uint1 *out2_local;
  uint64_t *out1_local;
  
  *out2 = arg2 < arg3 || arg2 - arg3 < (ulong)(arg1 != '\0');
  *out1 = (arg2 - arg3) - (ulong)(arg1 != '\0');
  return;
}

Assistant:

__attribute__((target("adx,bmi2")))
static inline void fiat_subborrowx_u64(uint64_t* out1, fiat_uint1* out2, fiat_uint1 arg1, uint64_t arg2, uint64_t arg3) {
#if defined(__has_builtin)
#  if __has_builtin(__builtin_ia32_subborrow_u64)
#    define subborrow64 __builtin_ia32_subborrow_u64
#  endif
#endif
#if defined(subborrow64)
  long long unsigned int t;
  *out2 = subborrow64(arg1, arg2, arg3, &t);
  *out1 = t;
#elif defined(_M_X64)
  long long unsigned int t;
  *out2 = _subborrow_u64(arg1, arg2, arg3, &t); // NOTE: edited after generation
  *out1 = t;
#else
  *out1 = arg2 - arg3 - arg1;
  *out2 = (arg2 < arg3) | ((arg2 == arg3) & arg1);
#endif
#undef subborrow64
}